

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_sbox_verify_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong *puVar4;
  bool bVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8 [2];
  ulong local_d8 [2];
  ulong local_c8 [2];
  ulong local_b8 [2];
  ulong local_a8 [2];
  ulong local_98 [2];
  ulong local_88 [2];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  puVar12 = local_88;
  puVar7 = &local_78;
  puVar8 = local_98;
  puVar4 = local_a8;
  puVar13 = local_b8;
  puVar9 = local_c8;
  puVar10 = local_d8;
  puVar11 = local_e8;
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    uVar1 = in[lVar3];
    uVar6 = rvec[lVar3];
    *puVar9 = uVar1 * 4 & 0x9249249000000000;
    *puVar11 = uVar1 & 0x9249249000000000;
    *puVar10 = uVar1 * 2 & 0x9249249000000000;
    puVar9 = &local_f0;
    *puVar7 = uVar6 & 0x2492492400000000;
    *puVar13 = uVar6 & 0x9249249000000000;
    lVar3 = 1;
    puVar13 = &local_58;
    *puVar12 = (uVar6 & 0x2492492400000000) << 2;
    puVar10 = &local_f8;
    puVar12 = &local_40;
    puVar7 = &local_38;
    *puVar8 = uVar6 & 0x4924924800000000;
    puVar8 = &local_48;
    *puVar4 = (uVar6 & 0x4924924800000000) * 2;
    puVar11 = &local_60;
    puVar4 = &local_50;
    bVar2 = false;
  } while (bVar5);
  puVar7 = local_d8;
  puVar8 = local_c8;
  local_68 = local_c8[0];
  local_70 = local_f0;
  local_78 = local_d8[0] & local_f0 ^ local_b8[0] ^ (local_f8 ^ local_d8[0]) & local_c8[0] ^
             local_58;
  uVar1 = view->t[1];
  local_38 = uVar1 & 0x9249249000000000;
  local_b8[0] = local_f8 & local_e8[0] ^ local_a8[0] ^ local_d8[0] & (local_60 ^ local_e8[0]) ^
                local_50;
  local_98[0] = (local_60 ^ local_e8[0]) & local_c8[0] ^ local_e8[0] & local_f0 ^ local_88[0] ^
                local_40;
  local_58 = uVar1 * 2 & 0x9249249000000000;
  lVar3 = 0;
  view->t[0] = local_98[0] >> 2 ^ local_78 ^ local_b8[0] >> 1;
  local_48 = (uVar1 & 0x2492492400000000) << 2;
  puVar4 = local_98;
  puVar13 = local_b8;
  puVar9 = local_e8;
  puVar10 = &local_78;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    uVar1 = *puVar8;
    puVar8 = &local_f0;
    uVar6 = uVar1 ^ *puVar7;
    puVar7 = &local_f8;
    in[lVar3] = (*puVar4 ^ uVar6) >> 1 ^ in[lVar3] & 0x3ffffffff ^ uVar6 ^
                (*puVar13 ^ uVar1) >> 2 ^ *puVar10 ^ *puVar9;
    lVar3 = 1;
    puVar4 = &local_48;
    puVar13 = &local_58;
    puVar9 = &local_60;
    puVar10 = &local_38;
    bVar2 = false;
  } while (bVar5);
  return;
}

Assistant:

static void mpc_sbox_verify_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_VERIFY);

  mpc_and_verify_uint64(r0m, x0s, x1s, r2m, view, MASK_X2I, 0);
  mpc_and_verify_uint64(r2m, x1s, x2m, r1s, view, MASK_X2I, 1);
  mpc_and_verify_uint64(r1m, x0s, x2m, r0s, view, MASK_X2I, 2);

  bitsliced_step_2_uint64_10(SC_VERIFY);
}